

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O1

bool DiffDistTest2<unsigned_long,Blob<224>>(pfHash hash,bool drawDiagram)

{
  undefined1 auVar1 [32];
  bool bVar2;
  Blob<224> *__cur;
  void *__s;
  int keybit;
  uint bit;
  bool bVar3;
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar7 [32];
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  Blob<224> t;
  unsigned_long k;
  Blob<224> h1;
  Blob<224> h2;
  undefined1 local_d8 [16];
  pointer local_c8;
  undefined1 local_b8 [32];
  Rand local_98;
  undefined1 local_80 [8];
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined4 uStack_3c;
  undefined1 auVar6 [32];
  
  local_98.x = 0x407129e7;
  local_98.y = 0x7888093c;
  local_98.z = 0x760425e2;
  local_98.w = 0x898677b9;
  local_d8 = ZEXT816(0) << 0x20;
  local_c8 = (pointer)0x0;
  __s = operator_new(0x3800000);
  local_d8._8_8_ = __s;
  local_d8._0_8_ = __s;
  local_c8 = (pointer)((long)__s + 0x3800000);
  memset(__s,0,0x3800000);
  local_d8._8_8_ = (pointer)((long)__s + 0x3800000);
  uStack_68 = 0;
  uStack_64 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_6c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  bVar3 = true;
  bit = 0;
  do {
    printf("Testing bit %d\n",(ulong)bit);
    lVar4 = 0;
    do {
      Rand::rand_p(&local_98,local_80,8);
      (*hash)(local_80,8,0,&local_78);
      flipbit(local_80,8,bit);
      (*hash)(local_80,8,0,&local_58);
      auVar5._8_4_ = uStack_70;
      auVar5._0_8_ = local_78;
      auVar5._12_4_ = uStack_6c;
      auVar5._16_4_ = uStack_68;
      auVar5._20_8_ = uStack_64;
      auVar5._28_4_ = uStack_5c;
      auVar5 = vmovdqu8_avx512vl(auVar5);
      auVar6._0_28_ = auVar5._0_28_;
      auVar6._30_2_ = auVar5._30_2_;
      auVar6._28_2_ = 0;
      auVar1._8_4_ = uStack_50;
      auVar1._0_8_ = local_58;
      auVar1._12_4_ = uStack_4c;
      auVar1._16_4_ = uStack_48;
      auVar1._20_8_ = uStack_44;
      auVar1._28_4_ = uStack_3c;
      auVar5 = vmovdqu8_avx512vl(auVar1);
      auVar7._0_28_ = auVar5._0_28_;
      auVar7._30_2_ = auVar5._30_2_;
      auVar7._28_2_ = 0;
      local_b8 = vmovdqu8_avx512vl(auVar7 ^ auVar6);
      *(undefined8 *)((uint8_t *)local_d8._0_8_ + lVar4 + 0xc) = local_b8._12_8_;
      *(undefined8 *)((uint8_t *)local_d8._0_8_ + lVar4 + 0xc + 8) = local_b8._20_8_;
      *(undefined8 *)((uint8_t *)local_d8._0_8_ + lVar4) = local_b8._0_8_;
      *(undefined8 *)((uint8_t *)local_d8._0_8_ + lVar4 + 8) = local_b8._8_8_;
      lVar4 = lVar4 + 0x1c;
    } while (lVar4 != 0x3800000);
    bVar2 = TestHashList<Blob<224>>
                      ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)local_d8,true,true,
                       drawDiagram,true,true);
    bVar3 = (bool)(bVar3 & bVar2);
    putchar(10);
    bit = bit + 1;
  } while (bit != 0x40);
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_);
  }
  return bVar3;
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}